

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O3

void Wlc_NtkReport(Wlc_Ntk_t *p,Abc_Cex_t *pCex,char *pName,int Radix)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  Vec_Str_t *__ptr;
  int nBits;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x72,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
  }
  iVar4 = Abc_NamStrFind(p->pManName,pName);
  if (iVar4 < 1) {
    pcVar8 = "Cannot find \"%s\" among nodes of the network.\n";
  }
  else {
    iVar1 = (p->vValues).nSize;
    if (iVar1 < 3) {
      iVar6 = -1;
      iVar4 = 0;
      nBits = -1;
    }
    else {
      piVar2 = (p->vValues).pArray;
      uVar3 = 2;
      do {
        uVar7 = uVar3;
        iVar6 = (int)uVar7;
        if (piVar2[uVar7 - 2] == iVar4) {
          iVar4 = iVar6 + -2;
          goto LAB_001ca761;
        }
        uVar3 = uVar7 + 3;
      } while ((int)(uVar7 + 3) < iVar1);
      iVar4 = iVar6 + 1;
LAB_001ca761:
      iVar6 = piVar2[(ulong)(iVar6 - 2) + 1];
      nBits = piVar2[uVar7 & 0xffffffff];
    }
    if (iVar4 != iVar1) {
      if (((uint)Radix < 0x11) && ((0x10404U >> (Radix & 0x1fU) & 1) != 0)) {
        __ptr = Wlc_ConvertToRadix((uint *)(pCex + 1),iVar6,nBits,Radix);
        pcVar8 = "";
        if (Radix == 2) {
          pcVar8 = "#b";
        }
        pcVar5 = "#x";
        if (Radix != 0x10) {
          pcVar5 = pcVar8;
        }
        pcVar8 = __ptr->pArray;
        printf("((%s %s%s))\n",pName,pcVar5,pcVar8);
        if (pcVar8 != (char *)0x0) {
          free(pcVar8);
        }
        free(__ptr);
        return;
      }
      __assert_fail("Radix == 2 || Radix == 10 || Radix == 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                    ,0x85,"void Wlc_NtkReport(Wlc_Ntk_t *, Abc_Cex_t *, char *, int)");
    }
    pcVar8 = "Cannot find \"%s\" among primary inputs of the network.\n";
  }
  printf(pcVar8,pName);
  return;
}

Assistant:

void Wlc_NtkReport( Wlc_Ntk_t * p, Abc_Cex_t * pCex, char * pName, int Radix )
{
    Vec_Str_t * vNum;
    int i, NameId, Name, Start = -1, nBits = -1;
    assert( pCex->nRegs == 0 );
    // get the name ID
    NameId = Abc_NamStrFind( p->pManName, pName );
    if ( NameId <= 0 )
    {
        printf( "Cannot find \"%s\" among nodes of the network.\n", pName );
        return;
    }
    // get the primary input
    Vec_IntForEachEntryTriple( &p->vValues, Name, Start, nBits, i )
        if ( Name == NameId )
            break;
    // find the PI
    if ( i == Vec_IntSize(&p->vValues) )
    {
        printf( "Cannot find \"%s\" among primary inputs of the network.\n", pName );
        return;
    }
    // print value
    assert( Radix == 2 || Radix == 10 || Radix == 16 );
    vNum = Wlc_ConvertToRadix( pCex->pData, Start, nBits, Radix );
    printf( "((%s %s%s))\n", pName, Radix == 16 ? "#x" : (Radix == 2 ? "#b" : ""), Vec_StrArray(vNum) );
    Vec_StrFree( vNum );
}